

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomIncludes::read(DomIncludes *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  DomInclude *this_00;
  char16_t *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView QVar2;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar2.m_data = L"include";
        QVar2.m_size = 7;
        __nbytes_00 = L"include";
        iVar1 = QtPrivate::compareStrings(local_48,QVar2,CaseInsensitive);
        if (iVar1 == 0) {
          this_00 = (DomInclude *)operator_new(0x58);
          (this_00->m_text).d.d = (Data *)0x0;
          (this_00->m_text).d.ptr = (char16_t *)0x0;
          (this_00->m_text).d.size = 0;
          (this_00->m_attr_location).d.d = (Data *)0x0;
          (this_00->m_attr_location).d.ptr = (char16_t *)0x0;
          (this_00->m_attr_location).d.size = 0;
          *(undefined8 *)&this_00->m_has_attr_location = 0;
          (this_00->m_attr_impldecl).d.d = (Data *)0x0;
          (this_00->m_attr_impldecl).d.ptr = (char16_t *)0x0;
          (this_00->m_attr_impldecl).d.size = 0;
          *(undefined8 *)&this_00->m_has_attr_impldecl = 0;
          DomInclude::read(this_00,__fd,__buf_00,(size_t)__nbytes_00);
          local_60.d.d = (Data *)this_00;
          QtPrivate::QPodArrayOps<DomInclude*>::emplace<DomInclude*&>
                    ((QPodArrayOps<DomInclude*> *)&this->m_include,(this->m_include).d.size,
                     (DomInclude **)&local_60);
          QList<DomInclude_*>::end(&this->m_include);
        }
        else {
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_60,&local_78);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          if ((DomInclude *)local_60.d.d != (DomInclude *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else if (iVar1 == 5) break;
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomIncludes::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"include"_s, Qt::CaseInsensitive)) {
                auto *v = new DomInclude();
                v->read(reader);
                m_include.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}